

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

uint8_t __thiscall Palette::size(Palette *this)

{
  unsigned_short *puVar1;
  
  puVar1 = std::
           __find_if<unsigned_short_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                     ((this->colors)._M_elems + options.hasTransparentPixels,this + 1);
  return (char)((int)puVar1 - ((int)this + (uint)options.hasTransparentPixels * 2) >> 1) +
         options.hasTransparentPixels;
}

Assistant:

uint8_t Palette::size() const {
	return indexOf(UINT16_MAX);
}